

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

HeapArgumentsObject * __thiscall
Js::JavascriptLibrary::CreateHeapArguments
          (JavascriptLibrary *this,Var frameObj,uint32 formalCount,bool isStrictMode)

{
  code *pcVar1;
  DynamicType *pDVar2;
  RecyclableObject *pRVar3;
  bool bVar4;
  uint16 uVar5;
  DynamicType **ppDVar6;
  undefined4 *puVar7;
  DynamicTypeHandler *pDVar8;
  Recycler *alloc;
  HeapArgumentsObject *this_00;
  RecyclableObject *pRVar9;
  RecyclableObject *local_b0;
  WriteBarrierPtr *local_78;
  TrackAllocData local_58;
  DynamicType *local_30;
  DynamicType *argumentsType;
  Recycler *recycler;
  bool isStrictMode_local;
  RecyclableObject *pRStack_18;
  uint32 formalCount_local;
  Var frameObj_local;
  JavascriptLibrary *this_local;
  
  recycler._3_1_ = isStrictMode;
  recycler._4_4_ = formalCount;
  pRStack_18 = (RecyclableObject *)frameObj;
  frameObj_local = this;
  ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->heapArgumentsType);
  if (*ppDVar6 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1713,"(heapArgumentsType)","Where\'s heapArgumentsType?");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->strictHeapArgumentsType);
  if (*ppDVar6 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1714,"(strictHeapArgumentsType)","strictHeapArgumentsType");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  argumentsType = (DynamicType *)GetRecycler(this);
  EnsureArrayPrototypeValuesFunction(this);
  if ((recycler._3_1_ & 1) == 0) {
    local_78 = (WriteBarrierPtr *)&this->heapArgumentsType;
  }
  else {
    local_78 = (WriteBarrierPtr *)&this->strictHeapArgumentsType;
  }
  ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__(local_78);
  pDVar2 = argumentsType;
  local_30 = *ppDVar6;
  pDVar8 = DynamicType::GetTypeHandler(local_30);
  uVar5 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar8);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&HeapArgumentsObject::typeinfo,(ulong)uVar5 << 3,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x171e);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar2,&local_58);
  pDVar8 = DynamicType::GetTypeHandler(local_30);
  DynamicTypeHandler::GetInlineSlotCapacity(pDVar8);
  this_00 = (HeapArgumentsObject *)new<Memory::Recycler>(0x38,alloc,0x473830,0);
  pRVar3 = pRStack_18;
  pDVar2 = argumentsType;
  pRVar9 = JavascriptLibraryBase::GetNull(&this->super_JavascriptLibraryBase);
  if (pRVar3 == pRVar9) {
    local_b0 = (RecyclableObject *)0x0;
  }
  else {
    local_b0 = pRStack_18;
  }
  HeapArgumentsObject::HeapArgumentsObject
            (this_00,(Recycler *)pDVar2,(ActivationObject *)local_b0,recycler._4_4_,local_30);
  return this_00;
}

Assistant:

HeapArgumentsObject* JavascriptLibrary::CreateHeapArguments(Var frameObj, uint32 formalCount, bool isStrictMode)
    {
        AssertMsg(heapArgumentsType, "Where's heapArgumentsType?");
        Assert(strictHeapArgumentsType);

        Recycler *recycler = this->GetRecycler();

        EnsureArrayPrototypeValuesFunction(); //InitializeArrayPrototype can be delay loaded, which could prevent us from access to array.prototype.values

        DynamicType * argumentsType = isStrictMode ? strictHeapArgumentsType : heapArgumentsType;

        return RecyclerNewPlusZ(recycler, argumentsType->GetTypeHandler()->GetInlineSlotCapacity() * sizeof(Var), HeapArgumentsObject, recycler,
            frameObj != GetNull() ? static_cast<ActivationObject*>(frameObj) : nullptr,
            formalCount, argumentsType);
    }